

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

SequenceReset *
anon_unknown.dwarf_2926b4::createSequenceReset
          (SequenceReset *__return_storage_ptr__,char *sender,char *target,int seq,int newSeq)

{
  int iVar1;
  Header *pHVar2;
  Trailer *this;
  FieldBase local_148;
  FieldBase local_f0;
  NewSeqNo local_88;
  undefined1 local_29;
  int local_28;
  int local_24;
  int newSeq_local;
  int seq_local;
  char *target_local;
  char *sender_local;
  SequenceReset *sequenceReset;
  
  local_29 = 0;
  local_28 = newSeq;
  local_24 = seq;
  _newSeq_local = target;
  target_local = sender;
  sender_local = (char *)__return_storage_ptr__;
  FIX42::SequenceReset::SequenceReset(__return_storage_ptr__);
  FIX::NewSeqNo::NewSeqNo(&local_88,(long)local_28);
  FIX42::SequenceReset::set(__return_storage_ptr__,&local_88);
  FIX::NewSeqNo::~NewSeqNo(&local_88);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  fillHeader((Header *)pHVar2,target_local,_newSeq_local,local_24);
  pHVar2 = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_f0,iVar1);
  FIX::FieldMap::setField((FieldMap *)pHVar2,&local_f0,true);
  FIX::BodyLength::~BodyLength((BodyLength *)&local_f0);
  this = FIX42::Message::getTrailer(&__return_storage_ptr__->super_Message);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_148,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_148,true);
  FIX::CheckSum::~CheckSum((CheckSum *)&local_148);
  return __return_storage_ptr__;
}

Assistant:

FIX42::SequenceReset createSequenceReset(const char *sender, const char *target, int seq, int newSeq) {
  FIX42::SequenceReset sequenceReset;
  sequenceReset.set(NewSeqNo(newSeq));
  fillHeader(sequenceReset.getHeader(), sender, target, seq);
  sequenceReset.getHeader().setField(BodyLength(sequenceReset.bodyLength()));
  sequenceReset.getTrailer().setField(CheckSum(sequenceReset.checkSum()));
  return sequenceReset;
}